

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O3

void __thiscall Fl_Shared_Image::reload(Fl_Shared_Image *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  Fl_Image *this_00;
  undefined4 extraout_var;
  long lVar5;
  uchar header [64];
  undefined4 local_68;
  undefined4 uStack_64;
  char local_60;
  Fl_Image *pFVar4;
  
  if (this->name_ == (char *)0x0) {
    return;
  }
  __stream = (FILE *)fl_fopen(this->name_,"rb");
  if (__stream == (FILE *)0x0) {
    return;
  }
  fread(&local_68,1,0x40,__stream);
  fclose(__stream);
  if (CONCAT31((undefined3)uStack_64,local_68._3_1_) == 0x656e6966 && local_68 == 0x66656423) {
    this_00 = (Fl_Image *)operator_new(0x38);
    Fl_XBM_Image::Fl_XBM_Image((Fl_XBM_Image *)this_00,this->name_);
  }
  else if (local_60 == '/' && CONCAT44(uStack_64,local_68) == 0x2a204d5058202a2f) {
    this_00 = (Fl_Image *)operator_new(0x38);
    Fl_XPM_Image::Fl_XPM_Image((Fl_XPM_Image *)this_00,this->name_);
  }
  else {
    if (num_handlers_ < 1) {
      return;
    }
    lVar5 = 0;
    while (this_00 = (*handlers_[lVar5])(this->name_,(uchar *)&local_68,0x40),
          this_00 == (Fl_Image *)0x0) {
      lVar5 = lVar5 + 1;
      if (num_handlers_ <= lVar5) {
        return;
      }
    }
  }
  if ((this->alloc_image_ != 0) && (this->image_ != (Fl_Image *)0x0)) {
    (*this->image_->_vptr_Fl_Image[1])();
  }
  this->alloc_image_ = 1;
  uVar1 = (this->super_Fl_Image).w_;
  if (uVar1 == 0 || this_00->w_ == uVar1) {
    uVar2 = (this->super_Fl_Image).h_;
    if (this_00->h_ == uVar2 || uVar2 == 0) {
      this->image_ = this_00;
      pFVar4 = this_00;
      goto LAB_001b103e;
    }
  }
  else {
    uVar2 = (this->super_Fl_Image).h_;
  }
  iVar3 = (*this_00->_vptr_Fl_Image[2])(this_00,(ulong)uVar1,(ulong)uVar2);
  pFVar4 = (Fl_Image *)CONCAT44(extraout_var,iVar3);
  (*this_00->_vptr_Fl_Image[1])(this_00);
  this->image_ = pFVar4;
  if (pFVar4 == (Fl_Image *)0x0) {
    return;
  }
LAB_001b103e:
  iVar3 = pFVar4->h_;
  (this->super_Fl_Image).w_ = pFVar4->w_;
  (this->super_Fl_Image).h_ = iVar3;
  (this->super_Fl_Image).d_ = pFVar4->d_;
  iVar3 = pFVar4->count_;
  (this->super_Fl_Image).data_ = pFVar4->data_;
  (this->super_Fl_Image).count_ = iVar3;
  return;
}

Assistant:

void Fl_Shared_Image::reload() {
  // Load image from disk...
  int		i;		// Looping var
  FILE		*fp;		// File pointer
  uchar		header[64];	// Buffer for auto-detecting files
  Fl_Image	*img;		// New image

  if (!name_) return;

  if ((fp = fl_fopen(name_, "rb")) != NULL) {
    if (fread(header, 1, sizeof(header), fp)==0) { /* ignore */ }
    fclose(fp);
  } else {
    return;
  }

  // Load the image as appropriate...
  if (memcmp(header, "#define", 7) == 0) // XBM file
    img = new Fl_XBM_Image(name_);
  else if (memcmp(header, "/* XPM */", 9) == 0) // XPM file
    img = new Fl_XPM_Image(name_);
  else {
    // Not a standard format; try an image handler...
    for (i = 0, img = 0; i < num_handlers_; i ++) {
      img = (handlers_[i])(name_, header, sizeof(header));

      if (img) break;
    }
  }

  if (img) {
    if (alloc_image_) delete image_;

    alloc_image_ = 1;

    if ((img->w() != w() && w()) || (img->h() != h() && h())) {
      // Make sure the reloaded image is the same size as the existing one.
      Fl_Image *temp = img->copy(w(), h());
      delete img;
      image_ = temp;
    } else {
      image_ = img;
    }

    update();
  }
}